

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O3

Var Js::GlobalObject::EntryEnabledDiagnosticsTrace(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  EventLog *this;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  JavascriptBoolean *pJVar5;
  JavascriptLibrary *this_00;
  int in_stack_00000010;
  undefined1 local_38 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x65a,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_38 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_38,(CallInfo *)&args.super_Arguments.Values);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (pSVar1->TTDShouldPerformReplayAction == true) {
    bVar3 = TTD::EventLog::ReplayTTDFetchAutoTraceStatusLogEvent(pSVar1->threadContext->TTDLog);
    this_00 = (((((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary;
  }
  else {
    if (pSVar1->TTDShouldPerformRecordAction != true) {
      return (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             booleanFalse.ptr;
    }
    this = pSVar1->threadContext->TTDLog;
    bVar3 = TTD::EventLog::GetAutoTraceEnabled(this);
    TTD::EventLog::RecordTTDFetchAutoTraceStatusEvent(this,bVar3);
    this_00 = (((((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary;
  }
  pJVar5 = JavascriptLibrary::CreateBoolean(this_00,(uint)bVar3);
  return pJVar5;
}

Assistant:

Var GlobalObject::EntryEnabledDiagnosticsTrace(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);

        if (function->GetScriptContext()->ShouldPerformReplayAction())
        {
            TTD::EventLog* ttlog = function->GetScriptContext()->GetThreadContext()->TTDLog;
            bool isEnabled = ttlog->ReplayTTDFetchAutoTraceStatusLogEvent();

            return function->GetScriptContext()->GetLibrary()->CreateBoolean(isEnabled);
        }
        else if (function->GetScriptContext()->ShouldPerformRecordAction())
        {
            TTD::EventLog* ttlog = function->GetScriptContext()->GetThreadContext()->TTDLog;
            bool isEnabled = ttlog->GetAutoTraceEnabled();
            ttlog->RecordTTDFetchAutoTraceStatusEvent(isEnabled);

            return function->GetScriptContext()->GetLibrary()->CreateBoolean(isEnabled);
        }
        else
        {
            return function->GetScriptContext()->GetLibrary()->GetFalse();
        }
    }